

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::ktx_texture::read_from_stream(ktx_texture *this,data_stream_serializer *serializer)

{
  uint *puVar1;
  uint32 uVar2;
  vector<unsigned_char> *pvVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  undefined4 extraout_var;
  ulong *puVar10;
  byte bVar11;
  int iVar12;
  uint actual_size;
  uint uVar13;
  long lVar14;
  uint actual_size_1;
  uint uVar15;
  uint uVar16;
  uint32 uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  uint actual_size_3;
  uint uVar22;
  int iVar23;
  uint size_in_bytes;
  uint actual_size_4;
  uint32 uVar24;
  vector<unsigned_char> *pvVar25;
  int iVar26;
  ulong uVar27;
  long lVar29;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar38;
  uint uVar39;
  undefined1 auVar37 [16];
  uint uVar40;
  uint32 key_value_byte_size;
  uint8_vec key_value_data;
  uint8 pad_bytes [3];
  uint local_88;
  uint local_84;
  undefined8 local_80;
  vector<unsigned_char> local_78;
  uint local_68;
  undefined1 local_63 [3];
  ulong local_60;
  vector<crnlib::vector<unsigned_char>_> *local_58;
  uint local_50;
  uint local_4c;
  ulong local_48;
  uint local_3c;
  ulong local_38;
  
  clear(this);
  iVar5 = (*serializer->m_pStream->_vptr_data_stream[4])(serializer->m_pStream,this,0x40);
  if (((iVar5 == 0x40) &&
      (*(int *)((this->m_header).m_identifier + 8) == 0xa1a0a0d &&
       *(long *)(this->m_header).m_identifier == -0x44cecedfa7abb455)) &&
     ((uVar24 = (this->m_header).m_endianness, uVar24 == 0x4030201 || (uVar24 == 0x1020304)))) {
    this->m_opposite_endianness = uVar24 == 0x1020304;
    if (uVar24 == 0x1020304) {
      lVar9 = 3;
      do {
        uVar6 = *(uint *)((this->m_header).m_identifier + lVar9 * 4);
        *(uint *)((this->m_header).m_identifier + lVar9 * 4) =
             uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 != 0x10);
      uVar6 = (this->m_header).m_glTypeSize;
      if (4 < uVar6) {
        return false;
      }
      if ((0x16U >> (uVar6 & 0x1f) & 1) == 0) {
        return false;
      }
    }
    bVar4 = check_header(this);
    if (bVar4) {
      bVar4 = compute_pixel_info(this);
      if (!bVar4) {
        return false;
      }
      uVar24 = (this->m_header).m_bytesOfKeyValueData;
      local_80 = (elemental_vector *)&this->m_key_values;
      while (uVar24 != 0) {
        if (uVar24 < 4) {
          return false;
        }
        iVar5 = (*serializer->m_pStream->_vptr_data_stream[4])(serializer->m_pStream,&local_88,4);
        if (iVar5 != 4) {
          return false;
        }
        if (this->m_opposite_endianness == true) {
          local_88 = local_88 >> 0x18 | (local_88 & 0xff0000) >> 8 | (local_88 & 0xff00) << 8 |
                     local_88 << 0x18;
        }
        uVar6 = local_88;
        uVar24 = uVar24 - 4;
        if (uVar24 < local_88) {
          return false;
        }
        local_78.m_p = (uchar *)0x0;
        local_78.m_size = 0;
        local_78.m_capacity = 0;
        if (local_88 == 0) {
LAB_001919ea:
          uVar6 = (this->m_key_values).m_size;
          if ((this->m_key_values).m_capacity <= uVar6) {
            elemental_vector::increase_capacity
                      (local_80,uVar6 + 1,true,0x10,(object_mover)0x0,false);
            uVar6 = (this->m_key_values).m_size;
          }
          pvVar25 = (vector<unsigned_char> *)local_80->m_p + uVar6;
          pvVar3 = (vector<unsigned_char> *)local_80->m_p + uVar6;
          pvVar3->m_p = (uchar *)0x0;
          pvVar3->m_size = 0;
          pvVar3->m_capacity = 0;
          elemental_vector::increase_capacity
                    ((elemental_vector *)pvVar25,local_78.m_size,false,1,(object_mover)0x0,false);
          pvVar25->m_size = local_78.m_size;
          memcpy(pvVar25->m_p,local_78.m_p,(ulong)local_78.m_size);
          puVar1 = &(this->m_key_values).m_size;
          *puVar1 = *puVar1 + 1;
          uVar6 = local_88 - 1 & 3;
          uVar15 = uVar6 ^ 3;
          if ((uVar6 != 3) &&
             (uVar6 = (*serializer->m_pStream->_vptr_data_stream[4])
                                (serializer->m_pStream,local_63,(ulong)uVar15), uVar6 != uVar15))
          goto LAB_00191a9e;
          bVar4 = uVar15 <= uVar24 - local_88;
          if (!bVar4) {
            uVar15 = 0;
          }
          uVar24 = (uVar24 - local_88) - uVar15;
        }
        else {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_78,local_88,local_88 == 1,1,(object_mover)0x0,false)
          ;
          memset(local_78.m_p + local_78.m_size,0,(ulong)(uVar6 - local_78.m_size));
          local_78.m_size = uVar6;
          if ((local_88 == 0) ||
             (uVar6 = (*serializer->m_pStream->_vptr_data_stream[4])
                                (serializer->m_pStream,local_78.m_p), uVar6 == local_88))
          goto LAB_001919ea;
LAB_00191a9e:
          bVar4 = false;
        }
        if (local_78.m_p != (uchar *)0x0) {
          crnlib_free(local_78.m_p);
        }
        if (!bVar4) {
          return false;
        }
      }
      uVar24 = (this->m_header).m_numberOfMipmapLevels;
      iVar5 = uVar24 + (uVar24 == 0);
      uVar24 = (this->m_header).m_numberOfArrayElements;
      iVar20 = uVar24 + (uVar24 == 0);
      uVar17 = (this->m_header).m_pixelDepth;
      local_80 = (elemental_vector *)CONCAT44(local_80._4_4_,iVar5);
      uVar2 = (this->m_header).m_numberOfFaces;
      uVar6 = uVar17 + (uVar17 == 0);
      if (0xffff0000 < uVar2 * uVar6 * iVar20 * iVar5 - 0x10000) {
        uVar15 = (this->m_header).m_pixelWidth;
        uVar17 = (this->m_header).m_pixelHeight;
        uVar21 = this->m_block_dim;
        local_68 = uVar17 + (uVar17 == 0);
        local_58 = (vector<crnlib::vector<unsigned_char>_> *)CONCAT44(local_58._4_4_,uVar15);
        iVar12 = 0;
        if (-local_68 < uVar21 || -uVar15 < uVar21) {
          return false;
        }
        local_84 = CONCAT31(local_84._1_3_,uVar24 == 0 && uVar2 == 6);
        local_60 = CONCAT44(local_60._4_4_,this->m_bytes_per_block);
        uVar27 = 0;
        do {
          bVar11 = (byte)iVar12;
          uVar16 = uVar15 >> (bVar11 & 0x1f);
          uVar7 = local_68 >> (bVar11 & 0x1f);
          uVar22 = uVar6 >> (bVar11 & 0x1f);
          uVar16 = uVar16 + (uVar16 == 0) + (uVar21 - 1);
          if (uVar16 < uVar21) {
            return false;
          }
          uVar7 = uVar7 + (uVar7 == 0) + (uVar21 - 1);
          if (uVar7 < uVar21) {
            return false;
          }
          lVar9 = uVar27 + 4;
          uVar7 = (uVar16 / uVar21) * (uVar7 / uVar21) * this->m_bytes_per_block;
          if (uVar24 == 0 && uVar2 == 6) {
            lVar14 = (ulong)uVar7 + (ulong)(-uVar7 & 3);
            lVar29 = 0;
            auVar30._8_4_ = (int)lVar14;
            auVar30._0_8_ = lVar14;
            auVar30._12_4_ = (int)((ulong)lVar14 >> 0x20);
            iVar8 = 6;
            do {
              lVar9 = lVar9 + lVar14;
              lVar29 = lVar29 + auVar30._8_8_;
              iVar8 = iVar8 + -2;
            } while (iVar8 != 0);
            uVar27 = lVar29 + lVar9;
          }
          else {
            iVar23 = uVar22 + (uVar22 == 0);
            iVar8 = iVar23 + -1;
            auVar28._4_4_ = iVar8;
            auVar28._0_4_ = iVar8;
            auVar28._8_4_ = iVar8;
            auVar28._12_4_ = iVar8;
            iVar8 = 0;
            auVar28 = auVar28 ^ _DAT_001a7020;
            uVar16 = 0;
            do {
              if (uVar2 != 0) {
                uVar17 = 0;
                do {
                  iVar18 = 4;
                  uVar22 = 0;
                  uVar13 = 0;
                  uVar35 = 0;
                  do {
                    uVar34 = uVar35;
                    uVar33 = uVar13;
                    uVar32 = uVar22;
                    uVar31 = uVar16;
                    uVar16 = uVar7 + uVar31;
                    uVar22 = uVar7 + uVar32;
                    uVar13 = uVar7 + uVar33;
                    uVar35 = uVar7 + uVar34;
                    iVar19 = iVar18 + -4;
                    iVar26 = iVar18 + (iVar23 + 3U & 0xfffffffc);
                    iVar18 = iVar19;
                  } while (iVar26 != 8);
                  iVar19 = -iVar19;
                  auVar37._4_4_ = iVar19;
                  auVar37._0_4_ = iVar19;
                  auVar37._8_4_ = iVar19;
                  auVar37._12_4_ = iVar19;
                  auVar37 = (auVar37 | _DAT_001abe60) ^ _DAT_001a7020;
                  uVar36 = -(uint)(auVar28._0_4_ < auVar37._0_4_);
                  uVar38 = -(uint)(auVar28._4_4_ < auVar37._4_4_);
                  uVar39 = -(uint)(auVar28._8_4_ < auVar37._8_4_);
                  uVar40 = -(uint)(auVar28._12_4_ < auVar37._12_4_);
                  uVar16 = (~uVar40 & uVar35 | uVar34 & uVar40) +
                           (~uVar38 & uVar22 | uVar32 & uVar38) +
                           (~uVar39 & uVar13 | uVar33 & uVar39) +
                           (~uVar36 & uVar16 | uVar31 & uVar36);
                  uVar17 = uVar17 + 1;
                } while (uVar17 != uVar2);
              }
              iVar8 = iVar8 + 1;
            } while (iVar8 != iVar20);
            uVar27 = lVar9 + (ulong)uVar16 + (ulong)(-uVar16 & 3);
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 != iVar5);
        iVar5 = (*serializer->m_pStream->_vptr_data_stream[10])();
        local_48 = CONCAT44(extraout_var,iVar5);
        local_60 = uVar27;
        if (local_48 < uVar27) {
          console::warning(
                          "ktx_texture::read_from_stream: KTX file size is smaller than expected - trying to read anyway without imageSize fields"
                          );
        }
        local_58 = &this->m_image_data;
        local_38 = 0;
        while( true ) {
          bVar11 = (byte)local_38;
          uVar15 = (this->m_header).m_pixelWidth >> (bVar11 & 0x1f);
          uVar24 = (this->m_header).m_pixelHeight;
          uVar21 = uVar24 + (uVar24 == 0) >> (bVar11 & 0x1f);
          uVar24 = (this->m_header).m_pixelDepth;
          local_4c = uVar24 + (uVar24 == 0) >> (bVar11 & 0x1f);
          local_4c = local_4c + (local_4c == 0);
          uVar6 = this->m_block_dim;
          uVar15 = (uVar6 + uVar15 + (uVar15 == 0)) - 1;
          uVar21 = (uVar21 + (uVar21 == 0) + uVar6) - 1;
          local_84 = uVar21 / uVar6;
          if (uVar6 > uVar21 || uVar6 > uVar15) break;
          local_88 = 0;
          if (local_48 < local_60) {
            uVar24 = (this->m_header).m_numberOfArrayElements;
            local_88 = local_84 * (uVar15 / uVar6) * local_4c * this->m_bytes_per_block *
                       (uVar24 + (uVar24 == 0)) * (this->m_header).m_numberOfFaces;
          }
          else {
            iVar5 = (*serializer->m_pStream->_vptr_data_stream[4])
                              (serializer->m_pStream,&local_88,4);
            if (iVar5 != 4) {
              return false;
            }
            if (this->m_opposite_endianness == true) {
              local_88 = local_88 >> 0x18 | (local_88 & 0xff0000) >> 8 | (local_88 & 0xff00) << 8 |
                         local_88 << 0x18;
            }
          }
          if (local_88 == 0) {
            return false;
          }
          uVar7 = (this->m_header).m_numberOfArrayElements;
          uVar16 = (this->m_header).m_numberOfFaces;
          if (uVar16 == 6 && uVar7 == 0) {
            uVar7 = 0;
            local_80 = (elemental_vector *)((ulong)local_80._4_4_ << 0x20);
            do {
              local_78.m_p = (uchar *)0x0;
              local_78.m_size = 0;
              local_78.m_capacity = 0;
              vector<crnlib::vector<unsigned_char>_>::push_back(local_58,&local_78);
              vector<unsigned_char>::~vector(&local_78);
              pvVar25 = (this->m_image_data).m_p + ((this->m_image_data).m_size - 1);
              vector<unsigned_char>::resize(pvVar25,local_88,false);
              size_in_bytes = 0;
              if ((local_88 != 0) &&
                 (uVar16 = (*serializer->m_pStream->_vptr_data_stream[4])
                                     (serializer->m_pStream,pvVar25->m_p), size_in_bytes = local_88,
                 uVar16 != local_88)) {
                return false;
              }
              if (this->m_opposite_endianness == true) {
                utils::endian_swap_mem(pvVar25->m_p,size_in_bytes,(this->m_header).m_glTypeSize);
                size_in_bytes = local_88;
              }
              uVar22 = -size_in_bytes & 3;
              uVar16 = 0;
              if (local_48 < local_60) {
                uVar22 = 0;
              }
              if (((uVar22 == 0) ||
                  (uVar16 = (*serializer->m_pStream->_vptr_data_stream[4])
                                      (serializer->m_pStream,local_63,(ulong)uVar22),
                  uVar16 != uVar22)) && (uVar16 != uVar22)) {
                return false;
              }
              local_80 = (elemental_vector *)
                         CONCAT44(local_80._4_4_,(int)local_80 + uVar22 + local_88);
              uVar7 = uVar7 + 1;
            } while (uVar7 < (this->m_header).m_numberOfFaces);
          }
          else {
            local_84 = local_84 * (uVar15 / uVar6);
            uVar13 = 0;
            local_80 = (elemental_vector *)((ulong)local_80._4_4_ << 0x20);
            uVar22 = local_88;
            do {
              if (uVar16 == 0) {
                uVar16 = 0;
              }
              else {
                local_50 = 0;
                local_3c = uVar13;
                do {
                  uVar7 = 0;
                  do {
                    local_68 = uVar7;
                    uVar7 = this->m_bytes_per_block * local_84;
                    if (uVar22 <= uVar7 - 1) {
                      return false;
                    }
                    local_78.m_p = (uchar *)0x0;
                    local_78.m_size = 0;
                    local_78.m_capacity = 0;
                    uVar16 = (this->m_image_data).m_size;
                    if ((this->m_image_data).m_capacity <= uVar16) {
                      elemental_vector::increase_capacity
                                ((elemental_vector *)local_58,uVar16 + 1,true,0x10,(object_mover)0x0
                                 ,false);
                      uVar16 = (this->m_image_data).m_size;
                    }
                    pvVar25 = local_58->m_p + uVar16;
                    pvVar3 = local_58->m_p + uVar16;
                    pvVar3->m_p = (uchar *)0x0;
                    pvVar3->m_size = 0;
                    pvVar3->m_capacity = 0;
                    elemental_vector::increase_capacity
                              ((elemental_vector *)pvVar25,0,false,1,(object_mover)0x0,false);
                    pvVar25->m_size = 0;
                    uVar16 = (this->m_image_data).m_size;
                    (this->m_image_data).m_size = uVar16 + 1;
                    pvVar3 = (this->m_image_data).m_p;
                    pvVar25 = pvVar3 + uVar16;
                    uVar16 = pvVar3[uVar16].m_size;
                    if (uVar16 != uVar7) {
                      if (uVar16 <= uVar7) {
                        if (pvVar25->m_capacity < uVar7) {
                          elemental_vector::increase_capacity
                                    ((elemental_vector *)pvVar25,uVar7,uVar16 + 1 == uVar7,1,
                                     (object_mover)0x0,false);
                          uVar16 = pvVar25->m_size;
                        }
                        memset(pvVar25->m_p + uVar16,0,(ulong)(uVar7 - uVar16));
                      }
                      pvVar25->m_size = uVar7;
                    }
                    uVar16 = (*serializer->m_pStream->_vptr_data_stream[4])
                                       (serializer->m_pStream,pvVar25->m_p,(ulong)uVar7);
                    if (uVar16 != uVar7) {
                      return false;
                    }
                    if (this->m_opposite_endianness == true) {
                      puVar10 = (ulong *)pvVar25->m_p;
                      uVar24 = (this->m_header).m_glTypeSize;
                      if (uVar24 == 8) {
                        if (7 < uVar7) {
                          uVar16 = uVar7 >> 3;
                          do {
                            uVar27 = *puVar10;
                            *puVar10 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                                       (uVar27 & 0xff0000000000) >> 0x18 |
                                       (uVar27 & 0xff00000000) >> 8 | (uVar27 & 0xff000000) << 8 |
                                       (uVar27 & 0xff0000) << 0x18 | (uVar27 & 0xff00) << 0x28 |
                                       uVar27 << 0x38;
                            puVar10 = puVar10 + 1;
                            uVar16 = uVar16 - 1;
                          } while (uVar16 != 0);
                        }
                      }
                      else if (uVar24 == 4) {
                        if (3 < uVar7) {
                          uVar16 = uVar7 >> 2;
                          do {
                            uVar13 = (uint)*puVar10;
                            *(uint *)puVar10 =
                                 uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8
                                 | uVar13 << 0x18;
                            puVar10 = (ulong *)((long)puVar10 + 4);
                            uVar16 = uVar16 - 1;
                          } while (uVar16 != 0);
                        }
                      }
                      else if ((uVar24 == 2) && (1 < uVar7)) {
                        uVar16 = uVar7 >> 1;
                        do {
                          *(ushort *)puVar10 = (ushort)*puVar10 << 8 | (ushort)*puVar10 >> 8;
                          puVar10 = (ulong *)((long)puVar10 + 2);
                          uVar16 = uVar16 - 1;
                        } while (uVar16 != 0);
                      }
                    }
                    uVar22 = uVar22 - uVar7;
                    local_80 = (elemental_vector *)CONCAT44(local_80._4_4_,(int)local_80 + uVar7);
                    uVar7 = local_68 + 1;
                  } while (local_68 + 1 != local_4c);
                  local_50 = local_50 + 1;
                  uVar16 = (this->m_header).m_numberOfFaces;
                } while (local_50 < uVar16);
                uVar7 = (this->m_header).m_numberOfArrayElements;
                uVar13 = local_3c;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < uVar7);
            if (uVar22 != 0) {
              return false;
            }
          }
          uVar16 = -(int)local_80 & 3;
          uVar7 = 0;
          if (local_48 < local_60) {
            uVar16 = 0;
          }
          if (((uVar16 == 0) ||
              (uVar7 = (*serializer->m_pStream->_vptr_data_stream[4])
                                 (serializer->m_pStream,local_63,(ulong)uVar16), uVar7 != uVar16))
             && (uVar7 != uVar16)) {
            return false;
          }
          uVar7 = (int)local_38 + 1;
          local_38 = (ulong)uVar7;
          if ((this->m_header).m_numberOfMipmapLevels <= uVar7) {
            return uVar6 <= uVar21 && uVar6 <= uVar15;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ktx_texture::read_from_stream(data_stream_serializer& serializer)
    {
        clear();

        // Read header
        if (serializer.read(&m_header, 1, sizeof(m_header)) != sizeof(ktx_header))
        {
            return false;
        }

        // Check header
        if (memcmp(s_ktx_file_id, m_header.m_identifier, sizeof(m_header.m_identifier)))
        {
            return false;
        }

        if ((m_header.m_endianness != KTX_OPPOSITE_ENDIAN) && (m_header.m_endianness != KTX_ENDIAN))
        {
            return false;
        }

        m_opposite_endianness = (m_header.m_endianness == KTX_OPPOSITE_ENDIAN);
        if (m_opposite_endianness)
        {
            m_header.endian_swap();

            if ((m_header.m_glTypeSize != sizeof(uint8)) && (m_header.m_glTypeSize != sizeof(uint16)) && (m_header.m_glTypeSize != sizeof(uint32)))
            {
                return false;
            }
        }

        if (!check_header())
        {
            return false;
        }

        if (!compute_pixel_info())
        {
            return false;
        }

        uint8 pad_bytes[3];

        // Read the key value entries
        uint num_key_value_bytes_remaining = m_header.m_bytesOfKeyValueData;
        while (num_key_value_bytes_remaining)
        {
            if (num_key_value_bytes_remaining < sizeof(uint32))
            {
                return false;
            }

            uint32 key_value_byte_size;
            if (serializer.read(&key_value_byte_size, 1, sizeof(uint32)) != sizeof(uint32))
            {
                return false;
            }

            num_key_value_bytes_remaining -= sizeof(uint32);

            if (m_opposite_endianness)
            {
                key_value_byte_size = utils::swap32(key_value_byte_size);
            }

            if (key_value_byte_size > num_key_value_bytes_remaining)
            {
                return false;
            }

            uint8_vec key_value_data;
            if (key_value_byte_size)
            {
                key_value_data.resize(key_value_byte_size);
                if (serializer.read(&key_value_data[0], 1, key_value_byte_size) != key_value_byte_size)
                {
                    return false;
                }
            }

            m_key_values.push_back(key_value_data);

            uint padding = 3 - ((key_value_byte_size + 3) % 4);
            if (padding)
            {
                if (serializer.read(pad_bytes, 1, padding) != padding)
                {
                    return false;
                }
            }

            num_key_value_bytes_remaining -= key_value_byte_size;
            if (num_key_value_bytes_remaining < padding)
            {
                return false;
            }
            num_key_value_bytes_remaining -= padding;
        }

        // Now read the mip levels
        uint total_faces = get_num_mips() * get_array_size() * get_num_faces() * get_depth();
        if ((!total_faces) || (total_faces > 65535))
        {
            return false;
        }

// See Section 2.8 of KTX file format: No rounding to block sizes should be applied for block compressed textures.
// OK, I'm going to break that rule otherwise KTX can only store a subset of textures that DDS can handle for no good reason.
#if 0
      const uint mip0_row_blocks = m_header.m_pixelWidth / m_block_dim;
      const uint mip0_col_blocks = CRNLIB_MAX(1, m_header.m_pixelHeight) / m_block_dim;
#else
        const uint mip0_row_blocks = (m_header.m_pixelWidth + m_block_dim - 1) / m_block_dim;
        const uint mip0_col_blocks = (CRNLIB_MAX(1, m_header.m_pixelHeight) + m_block_dim - 1) / m_block_dim;
#endif
        if ((!mip0_row_blocks) || (!mip0_col_blocks))
        {
            return false;
        }

        bool has_valid_image_size_fields = true;
        bool disable_mip_and_cubemap_padding = false;

#if CRNLIB_KTX_PVRTEX_WORKAROUNDS
        {
            // PVRTexTool has a bogus KTX writer that doesn't write any imageSize fields. Nice.
            size_t expected_bytes_remaining = 0;
            for (uint mip_level = 0; mip_level < get_num_mips(); mip_level++)
            {
                uint mip_width, mip_height, mip_depth;
                get_mip_dim(mip_level, mip_width, mip_height, mip_depth);

                const uint mip_row_blocks = (mip_width + m_block_dim - 1) / m_block_dim;
                const uint mip_col_blocks = (mip_height + m_block_dim - 1) / m_block_dim;
                if ((!mip_row_blocks) || (!mip_col_blocks))
                {
                    return false;
                }

                expected_bytes_remaining += sizeof(uint32);

                if ((!m_header.m_numberOfArrayElements) && (get_num_faces() == 6))
                {
                    for (uint face = 0; face < get_num_faces(); face++)
                    {
                        uint slice_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
                        expected_bytes_remaining += slice_size;

                        uint num_cube_pad_bytes = 3 - ((slice_size + 3) % 4);
                        expected_bytes_remaining += num_cube_pad_bytes;
                    }
                }
                else
                {
                    uint total_mip_size = 0;
                    for (uint array_element = 0; array_element < get_array_size(); array_element++)
                    {
                        for (uint face = 0; face < get_num_faces(); face++)
                        {
                            for (uint zslice = 0; zslice < mip_depth; zslice++)
                            {
                                uint slice_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
                                total_mip_size += slice_size;
                            }
                        }
                    }
                    expected_bytes_remaining += total_mip_size;

                    uint num_mip_pad_bytes = 3 - ((total_mip_size + 3) % 4);
                    expected_bytes_remaining += num_mip_pad_bytes;
                }
            }

            if (serializer.get_stream()->get_remaining() < expected_bytes_remaining)
            {
                has_valid_image_size_fields = false;
                disable_mip_and_cubemap_padding = true;
                console::warning("ktx_texture::read_from_stream: KTX file size is smaller than expected - trying to read anyway without imageSize fields");
            }
        }
#endif

        for (uint mip_level = 0; mip_level < get_num_mips(); mip_level++)
        {
            uint mip_width, mip_height, mip_depth;
            get_mip_dim(mip_level, mip_width, mip_height, mip_depth);

            const uint mip_row_blocks = (mip_width + m_block_dim - 1) / m_block_dim;
            const uint mip_col_blocks = (mip_height + m_block_dim - 1) / m_block_dim;
            if ((!mip_row_blocks) || (!mip_col_blocks))
            {
                return false;
            }

            uint32 image_size = 0;
            if (!has_valid_image_size_fields)
            {
                image_size = mip_depth * mip_row_blocks * mip_col_blocks * m_bytes_per_block * get_array_size() * get_num_faces();
            }
            else
            {
                if (serializer.read(&image_size, 1, sizeof(image_size)) != sizeof(image_size))
                {
                    return false;
                }

                if (m_opposite_endianness)
                {
                    image_size = utils::swap32(image_size);
                }
            }

            if (!image_size)
            {
                return false;
            }

            uint total_mip_size = 0;

            if ((!m_header.m_numberOfArrayElements) && (get_num_faces() == 6))
            {
                // plain non-array cubemap
                for (uint face = 0; face < get_num_faces(); face++)
                {
                    CRNLIB_ASSERT(m_image_data.size() == get_image_index(mip_level, 0, face, 0));

                    m_image_data.push_back(uint8_vec());
                    uint8_vec& image_data = m_image_data.back();

                    image_data.resize(image_size);
                    if (serializer.read(&image_data[0], 1, image_size) != image_size)
                    {
                        return false;
                    }

                    if (m_opposite_endianness)
                    {
                        utils::endian_swap_mem(&image_data[0], image_size, m_header.m_glTypeSize);
                    }

                    uint num_cube_pad_bytes = disable_mip_and_cubemap_padding ? 0 : (3 - ((image_size + 3) % 4));
                    if (serializer.read(pad_bytes, 1, num_cube_pad_bytes) != num_cube_pad_bytes)
                    {
                        return false;
                    }

                    total_mip_size += image_size + num_cube_pad_bytes;
                }
            }
            else
            {
                // 1D, 2D, 3D (normal or array texture), or array cubemap
                uint num_image_bytes_remaining = image_size;

                for (uint array_element = 0; array_element < get_array_size(); array_element++)
                {
                    for (uint face = 0; face < get_num_faces(); face++)
                    {
                        for (uint zslice = 0; zslice < mip_depth; zslice++)
                        {
                            CRNLIB_ASSERT(m_image_data.size() == get_image_index(mip_level, array_element, face, zslice));

                            uint slice_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
                            if ((!slice_size) || (slice_size > num_image_bytes_remaining))
                            {
                                return false;
                            }

                            m_image_data.push_back(uint8_vec());
                            uint8_vec& image_data = m_image_data.back();

                            image_data.resize(slice_size);
                            if (serializer.read(&image_data[0], 1, slice_size) != slice_size)
                            {
                                return false;
                            }

                            if (m_opposite_endianness)
                            {
                                utils::endian_swap_mem(&image_data[0], slice_size, m_header.m_glTypeSize);
                            }

                            num_image_bytes_remaining -= slice_size;

                            total_mip_size += slice_size;
                        }
                    }
                }

                if (num_image_bytes_remaining)
                {
                    return false;
                }
            }

            uint num_mip_pad_bytes = disable_mip_and_cubemap_padding ? 0 : (3 - ((total_mip_size + 3) % 4));
            if (serializer.read(pad_bytes, 1, num_mip_pad_bytes) != num_mip_pad_bytes)
            {
                return false;
            }
        }
        return true;
    }